

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor_pointer.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Creature goblin;
  IncreaseDefenseModifier rt2;
  CreatureModifier root;
  DoubleAttackModifier rt1;
  Creature local_98;
  CreatureModifier local_70;
  CreatureModifier local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  size_type local_38;
  char local_30 [8];
  undefined8 uStack_28;
  CreatureModifier local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Goblin",(allocator<char> *)&local_58);
  local_98.name._M_string_length = local_38;
  local_98.name._M_dataplus._M_p = (pointer)&local_98.name.field_2;
  if (local_40 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30) {
    local_98.name.field_2._8_8_ = uStack_28;
  }
  else {
    local_98.name._M_dataplus._M_p = (pointer)local_40;
  }
  local_38 = 0;
  local_30[0] = '\0';
  local_98.attack = 10;
  local_98.defense = 0xd;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_30;
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = operator<<((ostream *)&std::cout,&local_98);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_58._vptr_CreatureModifier = (_func_int **)&PTR__CreatureModifier_00103d10;
  local_58.next = (CreatureModifier *)0x0;
  local_20.next = (CreatureModifier *)0x0;
  local_70.next = (CreatureModifier *)0x0;
  local_20._vptr_CreatureModifier = (_func_int **)&PTR__CreatureModifier_00103d48;
  local_70._vptr_CreatureModifier = (_func_int **)&PTR__CreatureModifier_00103d88;
  local_70.creature._M_data = &local_98;
  local_58.creature._M_data = &local_98;
  local_20.creature._M_data = &local_98;
  CreatureModifier::add(&local_58,&local_20);
  CreatureModifier::add(&local_58,&local_70);
  if (local_58.next != (CreatureModifier *)0x0) {
    (*(local_58.next)->_vptr_CreatureModifier[2])();
  }
  poVar1 = operator<<((ostream *)&std::cout,&local_98);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_98);
  return 0;
}

Assistant:

int main()
{
	Creature goblin{"Goblin", 10, 13};
	std::cout << goblin << std::endl;

	CreatureModifier root{goblin};
	DoubleAttackModifier rt1{goblin};
	IncreaseDefenseModifier rt2{goblin};
	root.add(&rt1);
	root.add(&rt2);
	root.handle();

	std::cout << goblin << std::endl;
	return 0;
}